

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O1

void __thiscall Memory::HeapAllocatorData::LogFree(HeapAllocatorData *this,HeapAllocRecord *record)

{
  HeapAllocRecord *pHVar1;
  StackBackTrace *obj;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  HeapAllocatorData *pHVar5;
  
  if (record->data != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0x1d8,"(record->data == this)","record->data == this");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pHVar1 = record->next;
  if (pHVar1 != (HeapAllocRecord *)0x0) {
    pHVar1->prev = record->prev;
  }
  pHVar5 = (HeapAllocatorData *)&record->prev->next;
  if (record->prev == (HeapAllocRecord *)0x0) {
    pHVar5 = this;
  }
  pHVar5->head = pHVar1;
  this->deleteCount = this->deleteCount + 1;
  this->outstandingBytes = this->outstandingBytes - record->size;
  obj = record->stacktrace;
  if (obj != (StackBackTrace *)0x0) {
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
              ((AllocatorType *)&NoCheckHeapAllocator::Instance,obj,
               (ulong)obj->requestedFramesToCapture << 3);
    return;
  }
  return;
}

Assistant:

void
HeapAllocatorData::LogFree(HeapAllocRecord * record)
{
    Assert(record->data == this);

    // This is an expensive check for double free
#if 0
    HeapAllocRecord * curr = head;
    while (curr != nullptr)
    {
        if (curr == record)
        {
            break;
        }
        curr = curr->next;
    }
    Assert(curr != nullptr);
#endif
    if (record->next != nullptr)
    {
        record->next->prev = record->prev;
    }
    if (record->prev == nullptr)
    {
        head = record->next;
    }
    else
    {
        record->prev->next = record->next;
    }

    deleteCount++;
    outstandingBytes -= record->size;
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (record->stacktrace != nullptr)
    {
        record->stacktrace->Delete(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}